

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_notifications.cpp
# Opt level: O0

void AlertNotify(string *strMessage)

{
  string_view str;
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var2;
  thread t;
  string safeStatus;
  string singleQuote;
  string strCmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  string *search;
  string *strDefault;
  undefined1 in_stack_fffffffffffffec0 [16];
  ArgsManager *this_00;
  undefined4 in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  allocator<char> local_10c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10b [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  strDefault = (string *)((long)&local_10b[0]._M_dataplus._M_p + 2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec0._8_8_);
  search = (string *)((long)local_10b + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffed8,
             (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec0._8_8_);
  this_00 = in_stack_fffffffffffffec0._8_8_;
  ArgsManager::GetArg(this_00,in_stack_fffffffffffffec0._0_8_,strDefault);
  std::__cxx11::string::~string(in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator((allocator<char> *)((long)local_10b + 1));
  std::__cxx11::string::~string(in_stack_fffffffffffffe88);
  std::allocator<char>::~allocator((allocator<char> *)((long)&local_10b[0]._M_dataplus._M_p + 2));
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (in_stack_fffffffffffffe88);
  if (!bVar1) {
    this = local_10b;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (allocator<char> *)this_00);
    std::allocator<char>::~allocator((allocator<char> *)local_10b);
    _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
    str._M_str = (char *)in_stack_fffffffffffffee8;
    str._M_len = (size_t)in_RDI;
    SanitizeString_abi_cxx11_(str,in_stack_fffffffffffffed4);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var2._M_len
                   ,strDefault);
    std::operator+(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffee8,in_RDI);
    std::__cxx11::string::~string(in_stack_fffffffffffffe88);
    std::__cxx11::string::~string(in_stack_fffffffffffffe88);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffed8,
               (char *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (allocator<char> *)_Var2._M_str);
    util::ReplaceAll(strDefault,search,this);
    std::__cxx11::string::~string(in_stack_fffffffffffffe88);
    std::allocator<char>::~allocator(&local_10c);
    std::thread::thread<void(&)(std::__cxx11::string_const&),std::__cxx11::string&,void>
              ((thread *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
               (_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)
               _Var2._M_str,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var2._M_len);
    std::thread::detach();
    std::thread::~thread((thread *)in_stack_fffffffffffffe88);
    std::__cxx11::string::~string(in_stack_fffffffffffffe88);
    std::__cxx11::string::~string(in_stack_fffffffffffffe88);
  }
  std::__cxx11::string::~string(in_stack_fffffffffffffe88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void AlertNotify(const std::string& strMessage)
{
#if HAVE_SYSTEM
    std::string strCmd = gArgs.GetArg("-alertnotify", "");
    if (strCmd.empty()) return;

    // Alert text should be plain ascii coming from a trusted source, but to
    // be safe we first strip anything not in safeChars, then add single quotes around
    // the whole string before passing it to the shell:
    std::string singleQuote("'");
    std::string safeStatus = SanitizeString(strMessage);
    safeStatus = singleQuote+safeStatus+singleQuote;
    ReplaceAll(strCmd, "%s", safeStatus);

    std::thread t(runCommand, strCmd);
    t.detach(); // thread runs free
#endif
}